

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

void __thiscall wasm::ReferenceFinder::noteRefFunc(ReferenceFinder *this,Name refFunc)

{
  undefined1 local_18 [8];
  Name refFunc_local;
  
  refFunc_local.super_IString.str._M_len = refFunc.super_IString.str._M_str;
  local_18 = refFunc.super_IString.str._M_len;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->refFuncs,(value_type *)local_18);
  return;
}

Assistant:

void noteRefFunc(Name refFunc) { refFuncs.push_back(refFunc); }